

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::CallExpression::fromBuiltInMethod
          (CallExpression *this,Compilation *compilation,SymbolKind rootKind,Expression *expr,
          string_view methodName,InvocationExpressionSyntax *syntax,
          ArrayOrRandomizeMethodExpressionSyntax *withClause,ASTContext *context)

{
  Compilation *compilation_00;
  Expression *pEVar1;
  undefined4 in_register_00000014;
  SystemSubroutine *subroutine;
  SourceRange SVar2;
  string_view name;
  SourceLocation SVar3;
  SourceLocation in_stack_ffffffffffffffc0;
  SourceLocation SStack_38;
  
  subroutine = (SystemSubroutine *)CONCAT44(in_register_00000014,rootKind);
  pEVar1 = (Expression *)methodName._M_str;
  name._M_str = (char *)methodName._M_len;
  name._M_len = (size_t)expr;
  compilation_00 =
       (Compilation *)Compilation::getSystemMethod((Compilation *)this,(SymbolKind)compilation,name)
  ;
  if (compilation_00 == (Compilation *)0x0) {
    pEVar1 = (Expression *)0x0;
  }
  else {
    if (pEVar1 == (Expression *)0x0) {
      SVar3 = *(SourceLocation *)((long)&(subroutine->name).field_2 + 8);
      SStack_38 = *(SourceLocation *)&subroutine->kind;
      pEVar1 = (Expression *)0x0;
    }
    else {
      SVar2 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)pEVar1);
      SVar3 = SVar2.startLoc;
      SStack_38 = SVar2.endLoc;
      in_stack_ffffffffffffffc0 = SVar3;
    }
    SVar2.endLoc = SStack_38;
    SVar2.startLoc = SVar3;
    pEVar1 = createSystemCall(this,compilation_00,subroutine,pEVar1,syntax,withClause,SVar2,
                              (ASTContext *)0x0,(Scope *)in_stack_ffffffffffffffc0);
  }
  return pEVar1;
}

Assistant:

Expression* CallExpression::fromBuiltInMethod(
    Compilation& compilation, SymbolKind rootKind, const Expression& expr,
    std::string_view methodName, const InvocationExpressionSyntax* syntax,
    const ArrayOrRandomizeMethodExpressionSyntax* withClause, const ASTContext& context) {

    auto subroutine = compilation.getSystemMethod(rootKind, methodName);
    if (!subroutine)
        return nullptr;

    return &createSystemCall(compilation, *subroutine, &expr, syntax, withClause,
                             syntax ? syntax->sourceRange() : expr.sourceRange, context);
}